

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall libtorrent::aux::torrent::save_resume_data(torrent *this,resume_data_flags_t flags)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  add_torrent_params atp;
  undefined1 local_3a8 [16];
  _Function_base local_398;
  int64_t iStack_380;
  
  if (((this->super_torrent_hot_members).field_0x4b & 4) == 0) {
    if (((flags.m_val & 0xf8) == 0) ||
       (((this->m_need_save_resume_data).m_val & flags.m_val & 0xf8) != 0)) {
      (this->m_need_save_resume_data).m_val = '\0';
      state_updated(this);
      if (((flags.m_val & 1) != 0) && ((this->m_storage).m_disk_io != (disk_interface *)0x0)) {
        iVar1 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[4])();
        local_398._M_functor._M_unused._M_object = (void *)0x0;
        local_398._M_functor._8_8_ = (element_type *)0x0;
        local_398._M_manager = (_Manager_type)0x0;
        iStack_380 = 0;
        (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x38))
                  ((long *)CONCAT44(extraout_var,iVar1),(this->m_storage).m_idx.m_val);
        ::std::_Function_base::~_Function_base(&local_398);
        (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
          [0x1f])();
      }
      state_updated(this);
      add_torrent_params::add_torrent_params((add_torrent_params *)&stack0xfffffffffffffc90);
      write_resume_data(this,flags,(add_torrent_params *)&stack0xfffffffffffffc90);
      iVar1 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      get_handle((torrent *)local_3a8);
      alert_manager::
      emplace_alert<libtorrent::save_resume_data_alert,libtorrent::add_torrent_params,libtorrent::torrent_handle>
                ((alert_manager *)CONCAT44(extraout_var_00,iVar1),
                 (add_torrent_params *)&stack0xfffffffffffffc90,(torrent_handle *)local_3a8);
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_3a8 + 8));
      add_torrent_params::~add_torrent_params((add_torrent_params *)&stack0xfffffffffffffc90);
      return;
    }
    iVar1 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    get_handle((torrent *)&stack0xfffffffffffffc90);
    local_3a8._0_4_ = resume_data_not_modified;
    alert_manager::
    emplace_alert<libtorrent::save_resume_data_failed_alert,libtorrent::torrent_handle,libtorrent::errors::error_code_enum>
              ((alert_manager *)CONCAT44(extraout_var_02,iVar1),
               (torrent_handle *)&stack0xfffffffffffffc90,(error_code_enum *)local_3a8);
  }
  else {
    iVar1 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    get_handle((torrent *)&stack0xfffffffffffffc90);
    local_3a8._0_4_ = torrent_removed;
    alert_manager::
    emplace_alert<libtorrent::save_resume_data_failed_alert,libtorrent::torrent_handle,libtorrent::errors::error_code_enum>
              ((alert_manager *)CONCAT44(extraout_var_01,iVar1),
               (torrent_handle *)&stack0xfffffffffffffc90,(error_code_enum *)local_3a8);
  }
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffffc98);
  return;
}

Assistant:

void torrent::save_resume_data(resume_data_flags_t const flags)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		if (m_abort)
		{
			alerts().emplace_alert<save_resume_data_failed_alert>(get_handle()
				, errors::torrent_removed);
			return;
		}

		auto conditions = flags & (
			torrent_handle::if_counters_changed
			| torrent_handle::if_download_progress
			| torrent_handle::if_config_changed
			| torrent_handle::if_state_changed
			| torrent_handle::if_metadata_changed
			);

		if (conditions && !(m_need_save_resume_data & conditions))
		{
			// if conditions were specified, but none of those conditions are
			// met (i.e. none of them have been updated since last
			// save_resume_data()), we don't save it.
			alerts().emplace_alert<save_resume_data_failed_alert>(get_handle()
				, errors::resume_data_not_modified);
			return;
		}

		m_need_save_resume_data = resume_data_flags_t{};
		state_updated();

		if ((flags & torrent_handle::flush_disk_cache) && m_storage)
		{
			m_ses.disk_thread().async_release_files(m_storage);
			m_ses.deferred_submit_jobs();
		}

		state_updated();

		add_torrent_params atp;
		write_resume_data(flags, atp);
		alerts().emplace_alert<save_resume_data_alert>(std::move(atp), get_handle());
	}